

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O2

bool woff2::WriteFontCollection(FontCollection *font_collection,uint8_t *dst,size_t dst_size)

{
  uint8_t *puVar1;
  pointer pFVar2;
  bool bVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  Font *font;
  bool bVar7;
  size_t local_50;
  uint8_t *local_48;
  size_t local_40;
  size_t offset_table;
  
  local_50 = 0;
  if (font_collection->flavor == 0x74746366) {
    local_50 = 4;
    builtin_memcpy(dst,"ttcf",4);
    local_40 = dst_size;
    StoreU32(font_collection->header_version,&local_50,dst);
    StoreU32((uint32_t)
             (((long)(font_collection->fonts).
                     super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(font_collection->fonts).
                    super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x38),&local_50,dst);
    offset_table = local_50;
    sVar4 = local_50 + 0xc;
    for (uVar6 = 0;
        uVar6 < (ulong)(((long)(font_collection->fonts).
                               super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                        (long)(font_collection->fonts).
                              super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                              super__Vector_impl_data._M_start) / 0x38); uVar6 = uVar6 + 1) {
      local_50 = sVar4 - 8;
      puVar1 = dst + (sVar4 - 0xc);
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      sVar4 = sVar4 + 4;
    }
    if (font_collection->header_version == 0x20000) {
      puVar1 = dst + (sVar4 - 0xc);
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      puVar1 = dst + (sVar4 - 4);
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      local_50 = sVar4;
    }
    uVar6 = 0xffffffffffffffff;
    lVar5 = 0;
    local_48 = dst;
    do {
      puVar1 = local_48;
      pFVar2 = (font_collection->fonts).
               super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = uVar6 + 1;
      bVar7 = (ulong)(((long)(font_collection->fonts).
                             super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pFVar2) / 0x38) <= uVar6;
      if (bVar7) {
        return bVar7;
      }
      font = (Font *)((long)&pFVar2->flavor + lVar5);
      lVar5 = lVar5 + 0x38;
      StoreU32((uint32_t)local_50,&offset_table,local_48);
      bVar3 = WriteFont(font,&local_50,puVar1,local_40);
    } while (bVar3);
  }
  else {
    bVar7 = WriteFont((font_collection->fonts).
                      super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>._M_impl.
                      super__Vector_impl_data._M_start,&local_50,dst,dst_size);
  }
  return bVar7;
}

Assistant:

bool WriteFontCollection(const FontCollection& font_collection, uint8_t* dst,
                         size_t dst_size) {
  size_t offset = 0;

  // It's simpler if this just a simple sfnt
  if (font_collection.flavor != kTtcFontFlavor) {
    return WriteFont(font_collection.fonts[0], &offset, dst, dst_size);
  }

  // Write TTC header
  StoreU32(kTtcFontFlavor, &offset, dst);
  StoreU32(font_collection.header_version, &offset, dst);
  StoreU32(font_collection.fonts.size(), &offset, dst);

  // Offset Table, zeroed for now
  size_t offset_table = offset;  // where to write offsets later
  for (size_t i = 0; i < font_collection.fonts.size(); i++) {
    StoreU32(0, &offset, dst);
  }

  if (font_collection.header_version == 0x00020000) {
    StoreU32(0, &offset, dst);  // ulDsigTag
    StoreU32(0, &offset, dst);  // ulDsigLength
    StoreU32(0, &offset, dst);  // ulDsigOffset
  }

  // Write fonts and their offsets.
  for (size_t i = 0; i < font_collection.fonts.size(); i++) {
    const auto& font = font_collection.fonts[i];
    StoreU32(offset, &offset_table, dst);
    if (!WriteFont(font, &offset, dst, dst_size)) {
      return false;
    }
  }

  return true;
}